

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  size_t inlen_00;
  uint8_t *input_00;
  int iVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  code *cb;
  size_t decrypted_length;
  st_ptls_record_t local_50;
  size_t local_38;
  
  iVar1 = parse_record(tls,&local_50,(uint8_t *)input,inlen);
  input_00 = local_50.fragment;
  inlen_00 = local_50.length;
  if (iVar1 != 0) {
    return iVar1;
  }
  if (local_50.fragment == (uint8_t *)0x0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x16ed,
                  "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (local_50.type == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if (local_50.length != 1) {
      return 0x2f;
    }
    uVar5 = 0x202;
    if (*local_50.fragment != '\x01') {
      return 0x2f;
    }
    goto LAB_0010b222;
  }
  if ((local_50.type == '\x15') ||
     ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
    uVar2 = local_50.type;
    if ((local_50.type != '\x17') ||
       ((uVar2 = '\x17', (tls->field_0x1e8 & 1) == 0 ||
        (uVar3 = (tls->field_19).server.early_data_skipped_bytes, uVar3 == 0xffffffff))))
    goto LAB_0010b1c1;
  }
  else {
    if (local_50.type != '\x17') {
      return 0x28;
    }
    iVar1 = ptls_buffer_reserve_aligned(decryptbuf,local_50.length + 5,'\0');
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,&local_38
                         ,input_00,inlen_00);
    if (iVar1 == 0) {
      local_50.fragment = decryptbuf->base + decryptbuf->off;
      do {
        if (local_38 == 0) {
          return 10;
        }
        local_50.length = local_38 - 1;
        uVar2 = local_50.fragment[local_50.length];
        local_50.type = uVar2;
        local_38 = local_50.length;
      } while (uVar2 == '\0');
LAB_0010b1c1:
      if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (uVar2 != '\x16')) {
        if (uVar2 == '\x15') {
          uVar5 = 0x32;
          if (local_50.length == 2) {
            uVar5 = local_50.fragment[1] | 0x100;
          }
        }
        else {
          uVar5 = 10;
          if (uVar2 == '\x17') {
            if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
              if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
                 (uVar5 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
                decryptbuf->off = decryptbuf->off + local_50.length;
              }
            }
            else {
              decryptbuf->off = decryptbuf->off + local_50.length;
              uVar5 = 0;
            }
          }
        }
      }
      else {
        cb = handle_server_handshake_message;
        if ((tls->field_0x1e8 & 1) == 0) {
          cb = handle_client_handshake_message;
        }
        uVar5 = handle_handshake_record(tls,cb,emitter,&local_50,properties);
      }
      goto LAB_0010b222;
    }
    if ((tls->field_0x1e8 & 1) == 0) {
      return iVar1;
    }
    uVar3 = (tls->field_19).server.early_data_skipped_bytes;
    if (uVar3 == 0xffffffff) {
      return iVar1;
    }
  }
  uVar4 = (int)inlen_00 + uVar3;
  (tls->field_19).server.early_data_skipped_bytes = uVar4;
  uVar5 = 0x202;
  if (0x10000 < uVar4) {
    return 0x28;
  }
LAB_0010b222:
  ptls_buffer__release_memory(&(tls->recvbuf).rec);
  (tls->recvbuf).rec.base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  (tls->recvbuf).rec.off = 0;
  (tls->recvbuf).rec.is_allocated = '\0';
  (tls->recvbuf).rec.align_bits = '\0';
  *(undefined6 *)&(tls->recvbuf).rec.field_0x1a = 0;
  return uVar5;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}